

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O1

void * deallocmem(memory *m,int elemsize)

{
  uint uVar1;
  void **ppvVar2;
  int iVar3;
  void *pvVar4;
  
  ppvVar2 = &m->current;
  if (m->first < m->current) {
    *ppvVar2 = (void *)((long)m->current - (long)elemsize);
  }
  else {
    iVar3 = m->nr;
    uVar1 = iVar3 - 1;
    m->nr = uVar1;
    if (iVar3 < 1) {
      *ppvVar2 = (void *)0x0;
      m->first = (void *)0x0;
      m->last = (void *)0x0;
    }
    else {
      pvVar4 = m->block[uVar1];
      m->first = pvVar4;
      pvVar4 = (void *)((long)pvVar4 + ((long)m->blocksize - (long)elemsize));
      m->last = pvVar4;
      m->current = pvVar4;
    }
  }
  return *ppvVar2;
}

Assistant:

void *deallocmem(memory *m, int elemsize)
{
   if (m->current > m->first)
      m->current = (void *) ((char *) (m->current) - elemsize);
   else {
      m->nr--;
      if (m->nr >= 0) {
         m->first = m->block[m->nr];
         m->current = m->last = (void *)
            ((char *) (m->first) + m->blocksize - elemsize);
      } else
         m->current = m->first = m->last = NULL;
   }
   return m->current;
}